

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  longlong lVar4;
  ulong uVar5;
  Frame *pFVar6;
  long lVar7;
  Frame *pFVar8;
  Frame *local_1c8;
  Frame *local_1b0;
  Frame *f_5;
  longlong total_size_2;
  Frame *curr_2;
  Frame *prev_1;
  longlong delta_size;
  longlong bias;
  long exp;
  longlong delta_size_;
  Frame *curr_1;
  Frame *prev;
  Frame *curr;
  Frame *pf_end_2;
  Frame *pf_2;
  longlong frame_size_4;
  long lStack_128;
  int frame_count_1;
  longlong size_1;
  Frame *f_4;
  Frame *pf_end_1;
  Frame *pf_1;
  longlong frame_size_3;
  longlong total_size_1;
  Frame *f_3;
  longlong frame_size_2;
  longlong total_size;
  Frame *f_2;
  Frame *f_1;
  long lStack_c8;
  uchar val;
  long frame_size_1;
  long lStack_b8;
  int frame_count;
  longlong size;
  Frame *pf_end;
  Frame *pf;
  ulong local_98;
  Frame *local_90;
  byte local_81 [8];
  uchar biased_count;
  longlong frame_size;
  Frame *f;
  int local_54;
  long lStack_50;
  int lacing;
  longlong value;
  long status;
  IMkvReader *pReader;
  long len;
  longlong stop;
  longlong pos;
  Cluster *pCluster_local;
  Block *this_local;
  
  if (pCluster == (Cluster *)0x0) {
    this_local = (Block *)0xffffffffffffffff;
  }
  else if (pCluster->m_pSegment == (Segment *)0x0) {
    this_local = (Block *)0xffffffffffffffff;
  }
  else {
    pos = (longlong)pCluster;
    pCluster_local = (Cluster *)this;
    if (this->m_start < 0) {
      __assert_fail("m_start >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1dd7,"long mkvparser::Block::Parse(const Cluster *)");
    }
    if (this->m_size < 0) {
      __assert_fail("m_size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1dd8,"long mkvparser::Block::Parse(const Cluster *)");
    }
    if (0 < this->m_track) {
      __assert_fail("m_track <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1dd9,"long mkvparser::Block::Parse(const Cluster *)");
    }
    if (this->m_frames != (Frame *)0x0) {
      __assert_fail("m_frames == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1dda,"long mkvparser::Block::Parse(const Cluster *)");
    }
    if (0 < this->m_frame_count) {
      __assert_fail("m_frame_count <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1ddb,"long mkvparser::Block::Parse(const Cluster *)");
    }
    stop = this->m_start;
    len = this->m_start + this->m_size;
    status = (long)pCluster->m_pSegment->m_pReader;
    lVar4 = ReadUInt((IMkvReader *)status,stop,(long *)&pReader);
    this->m_track = lVar4;
    if (this->m_track < 1) {
      this_local = (Block *)0xfffffffffffffffe;
    }
    else if (len < (long)&pReader->_vptr_IMkvReader + stop) {
      this_local = (Block *)0xfffffffffffffffe;
    }
    else {
      stop = (long)&pReader->_vptr_IMkvReader + stop;
      if (len - stop < 2) {
        this_local = (Block *)0xfffffffffffffffe;
      }
      else {
        value = UnserializeInt((IMkvReader *)status,stop,2,&stack0xffffffffffffffb0);
        if (value == 0) {
          if (lStack_50 < -0x8000) {
            this_local = (Block *)0xfffffffffffffffe;
          }
          else if (lStack_50 < 0x8000) {
            this->m_timecode = (short)lStack_50;
            stop = stop + 2;
            if (len - stop < 1) {
              this_local = (Block *)0xfffffffffffffffe;
            }
            else {
              iVar3 = (*(code *)**(undefined8 **)status)(status,stop,1,&this->m_flags);
              value = (longlong)iVar3;
              if (value == 0) {
                local_54 = (int)(this->m_flags & 6) >> 1;
                stop = stop + 1;
                if (local_54 == 0) {
                  if (len < stop) {
                    this_local = (Block *)0xfffffffffffffffe;
                  }
                  else {
                    this->m_frame_count = 1;
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = (long)this->m_frame_count;
                    uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
                    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
                      uVar5 = 0xffffffffffffffff;
                    }
                    pFVar6 = (Frame *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
                    local_1b0 = (Frame *)0x0;
                    if (pFVar6 != (Frame *)0x0) {
                      local_1b0 = pFVar6;
                    }
                    this->m_frames = local_1b0;
                    if (this->m_frames == (Frame *)0x0) {
                      this_local = (Block *)0xffffffffffffffff;
                    }
                    else {
                      pFVar6 = this->m_frames;
                      pFVar6->pos = stop;
                      if (len - stop < 1) {
                        this_local = (Block *)0xfffffffffffffffe;
                      }
                      else {
                        pFVar6->len = len - stop;
                        this_local = (Block *)0x0;
                      }
                    }
                  }
                }
                else if (stop < len) {
                  iVar3 = (*(code *)**(undefined8 **)status)(status,stop,1,local_81);
                  value = (longlong)iVar3;
                  if (value == 0) {
                    stop = stop + 1;
                    if (len < stop) {
                      this_local = (Block *)0xfffffffffffffffe;
                    }
                    else {
                      this->m_frame_count = local_81[0] + 1;
                      auVar2._8_8_ = 0;
                      auVar2._0_8_ = (long)this->m_frame_count;
                      uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
                      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
                        uVar5 = 0xffffffffffffffff;
                      }
                      pFVar6 = (Frame *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
                      pf._7_1_ = pFVar6 != (Frame *)0x0;
                      local_1c8 = (Frame *)0x0;
                      if ((bool)pf._7_1_) {
                        local_1c8 = pFVar6;
                        local_98 = uVar5;
                        local_90 = pFVar6;
                      }
                      this->m_frames = local_1c8;
                      if (this->m_frames == (Frame *)0x0) {
                        this_local = (Block *)0xffffffffffffffff;
                      }
                      else if (this->m_frames == (Frame *)0x0) {
                        this_local = (Block *)0xfffffffffffffffe;
                      }
                      else {
                        if (local_54 == 1) {
                          size = (longlong)(this->m_frames + this->m_frame_count);
                          lStack_b8 = 0;
                          pf_end = this->m_frames;
                          for (frame_size_1._4_4_ = this->m_frame_count; 1 < frame_size_1._4_4_;
                              frame_size_1._4_4_ = frame_size_1._4_4_ + -1) {
                            lStack_c8 = 0;
                            lVar4 = value;
                            do {
                              value = lVar4;
                              if (len <= stop) {
                                return -2;
                              }
                              iVar3 = (*(code *)**(undefined8 **)status)
                                                (status,stop,1,(long)&f_1 + 7);
                              value = (longlong)iVar3;
                              if (value != 0) {
                                return -2;
                              }
                              stop = stop + 1;
                              lStack_c8 = (ulong)f_1._7_1_ + lStack_c8;
                              lVar4 = 0;
                            } while (f_1._7_1_ == 0xff);
                            pFVar6 = pf_end + 1;
                            if ((ulong)size <= pFVar6) {
                              pf_end = pFVar6;
                              __assert_fail("pf < pf_end",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1e5a,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if ((ulong)size <= pFVar6) {
                              return -2;
                            }
                            pf_end->pos = 0;
                            if (lStack_c8 < 1) {
                              return -2;
                            }
                            pf_end->len = lStack_c8;
                            lStack_b8 = lStack_c8 + lStack_b8;
                            pf_end = pFVar6;
                            value = 0;
                          }
                          if (((ulong)size <= pf_end) || (len < stop)) {
                            return -2;
                          }
                          if (pf_end + 1 != (Frame *)size) {
                            return -2;
                          }
                          pf_end->pos = 0;
                          if (len - stop < lStack_b8) {
                            return -2;
                          }
                          lVar7 = (len - stop) - lStack_b8;
                          if (lVar7 < 1) {
                            return -2;
                          }
                          pf_end->len = lVar7;
                          pf_end = this->m_frames;
                          while (pf_end != (Frame *)size) {
                            if (len < stop + pf_end->len) {
                              pf_end = pf_end + 1;
                              __assert_fail("(pos + f.len) <= stop",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1e84,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if (len < stop + pf_end->len) {
                              return -2;
                            }
                            pf_end->pos = stop;
                            stop = pf_end->len + stop;
                            pf_end = pf_end + 1;
                          }
                          if (stop != len) {
                            __assert_fail("pos == stop",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                          ,0x1e8d,"long mkvparser::Block::Parse(const Cluster *)");
                          }
                          if (stop != len) {
                            return -2;
                          }
                        }
                        else if (local_54 == 2) {
                          if (len <= stop) {
                            return -2;
                          }
                          if ((len - stop) % (long)this->m_frame_count != 0) {
                            return -2;
                          }
                          lVar7 = (len - stop) / (long)this->m_frame_count;
                          if (lVar7 < 1) {
                            return -2;
                          }
                          pFVar6 = this->m_frames;
                          iVar3 = this->m_frame_count;
                          pf_end_1 = pFVar6;
                          while (pf_end_1 != pFVar6 + iVar3) {
                            if (len < stop + lVar7) {
                              __assert_fail("(pos + frame_size) <= stop",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1ea3,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if (len < stop + lVar7) {
                              return -2;
                            }
                            pf_end_1->pos = stop;
                            pf_end_1->len = lVar7;
                            stop = lVar7 + stop;
                            pf_end_1 = pf_end_1 + 1;
                          }
                          if (stop != len) {
                            __assert_fail("pos == stop",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                          ,0x1eaf,"long mkvparser::Block::Parse(const Cluster *)");
                          }
                          if (stop != len) {
                            return -2;
                          }
                        }
                        else {
                          if (local_54 != 3) {
                            __assert_fail("lacing == 3",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                          ,0x1eb4,"long mkvparser::Block::Parse(const Cluster *)");
                          }
                          if (len <= stop) {
                            return -2;
                          }
                          frame_size_4._4_4_ = this->m_frame_count;
                          pf_2 = (Frame *)ReadUInt((IMkvReader *)status,stop,(long *)&pReader);
                          if ((long)pf_2 < 1) {
                            return -2;
                          }
                          if (0x7fffffffffffffff < (long)pf_2) {
                            return -2;
                          }
                          if (len < (long)&pReader->_vptr_IMkvReader + stop) {
                            return -2;
                          }
                          stop = (long)&pReader->_vptr_IMkvReader + stop;
                          if (len < (long)&pf_2->pos + stop) {
                            return -2;
                          }
                          pf_end_2 = this->m_frames;
                          pFVar6 = pf_end_2 + this->m_frame_count;
                          pf_end_2->pos = 0;
                          pf_end_2->len = (long)pf_2;
                          lStack_128 = pf_end_2->len;
                          while (frame_size_4._4_4_ = frame_size_4._4_4_ + -1,
                                1 < frame_size_4._4_4_) {
                            if (len <= stop) {
                              return -2;
                            }
                            if (pFVar6 <= pf_end_2) {
                              __assert_fail("pf < pf_end",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1ede,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if (pFVar6 <= pf_end_2) {
                              return -2;
                            }
                            pFVar8 = pf_end_2 + 1;
                            if ((Frame *)pf_end_2->len != pf_2) {
                              __assert_fail("prev.len == frame_size",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1ee3,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if ((Frame *)pf_end_2->len != pf_2) {
                              return -2;
                            }
                            if (pFVar6 <= pFVar8) {
                              __assert_fail("pf < pf_end",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1ee7,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if (pFVar6 <= pFVar8) {
                              return -2;
                            }
                            pFVar8->pos = 0;
                            lVar4 = ReadUInt((IMkvReader *)status,stop,(long *)&pReader);
                            if (lVar4 < 0) {
                              return -2;
                            }
                            if (len < (long)&pReader->_vptr_IMkvReader + stop) {
                              return -2;
                            }
                            stop = (long)&pReader->_vptr_IMkvReader + stop;
                            if (len < stop) {
                              return -2;
                            }
                            pf_2 = (Frame *)((lVar4 - ((1L << ((char)pReader * '\a' - 1U & 0x3f)) +
                                                      -1)) + (long)pf_2);
                            if ((long)pf_2 < 1) {
                              return -2;
                            }
                            if (0x7fffffffffffffff < (long)pf_2) {
                              return -2;
                            }
                            pf_end_2[1].len = (long)pf_2;
                            if (0x7fffffffffffffff - pf_end_2[1].len < lStack_128) {
                              return -2;
                            }
                            lStack_128 = pf_end_2[1].len + lStack_128;
                            pf_end_2 = pFVar8;
                          }
                          if (0 < frame_size_4._4_4_) {
                            if ((len < stop) || (pFVar6 <= pf_end_2)) {
                              return -2;
                            }
                            if ((Frame *)pf_end_2->len != pf_2) {
                              __assert_fail("prev.len == frame_size",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                                            ,0x1f17,"long mkvparser::Block::Parse(const Cluster *)")
                              ;
                            }
                            if ((Frame *)pf_end_2->len != pf_2) {
                              return -2;
                            }
                            if (pFVar6 <= pf_end_2 + 1) {
                              return -2;
                            }
                            if (pf_end_2 + 2 != pFVar6) {
                              return -2;
                            }
                            pf_end_2[1].pos = 0;
                            if (len - stop < lStack_128) {
                              return -2;
                            }
                            lStack_128 = (len - stop) - lStack_128;
                            if (lStack_128 < 1) {
                              return -2;
                            }
                            pf_end_2[1].len = lStack_128;
                          }
                          pf_end_2 = this->m_frames;
                          while (pf_end_2 != pFVar6) {
                            if (len < stop + pf_end_2->len) {
                              return -2;
                            }
                            pf_end_2->pos = stop;
                            stop = pf_end_2->len + stop;
                            pf_end_2 = pf_end_2 + 1;
                          }
                          if (stop != len) {
                            return -2;
                          }
                        }
                        this_local = (Block *)0x0;
                      }
                    }
                  }
                  else {
                    this_local = (Block *)0xfffffffffffffffe;
                  }
                }
                else {
                  this_local = (Block *)0xfffffffffffffffe;
                }
              }
              else {
                this_local = (Block *)0xfffffffffffffffe;
              }
            }
          }
          else {
            this_local = (Block *)0xfffffffffffffffe;
          }
        }
        else {
          this_local = (Block *)0xfffffffffffffffe;
        }
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}